

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ReturnStatement * __thiscall hdc::Parser::parse_return_statement(Parser *this)

{
  bool bVar1;
  reference pTVar2;
  Expression *expression;
  ReturnStatement *local_48;
  ReturnStatement *ret;
  Token token;
  Parser *this_local;
  
  token._40_8_ = this;
  Token::Token((Token *)&ret);
  expect(this,TK_RETURN);
  pTVar2 = __gnu_cxx::
           __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>::
           operator*(&this->matched);
  Token::operator=((Token *)&ret,pTVar2);
  bVar1 = lookahead(this,TK_NEWLINE);
  if (bVar1) {
    local_48 = (ReturnStatement *)operator_new(0x68);
    ReturnStatement::ReturnStatement(local_48,(Token *)&ret);
  }
  else {
    local_48 = (ReturnStatement *)operator_new(0x68);
    expression = parse_expression(this);
    ReturnStatement::ReturnStatement(local_48,(Token *)&ret,expression);
  }
  expect(this,TK_NEWLINE);
  Token::~Token((Token *)&ret);
  return local_48;
}

Assistant:

ReturnStatement* Parser::parse_return_statement() {
    Token token;
    ReturnStatement* ret;

    expect(TK_RETURN);
    token = *matched;

    if (lookahead(TK_NEWLINE)) {
        ret = new ReturnStatement(token);
    } else {
        ret = new ReturnStatement(token, parse_expression());
    }

    expect(TK_NEWLINE);
    return ret;
}